

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O2

bool __thiscall
tinyusdz::GeomPrimvar::get_value<tinyusdz::value::texcoord2f>
          (GeomPrimvar *this,double timecode,texcoord2f *dest,TimeSampleInterpolationType interp,
          string *err)

{
  bool bVar1;
  uint32_t tyid;
  string *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  Attribute *this_00;
  texcoord2f value;
  allocator local_b1;
  texcoord2f local_b0;
  double local_a8;
  undefined1 local_a0 [48];
  string local_70 [32];
  string local_50;
  
  local_a0._0_8_ = timecode;
  if (dest != (texcoord2f *)0x0) {
    this_00 = &this->_attr;
    args = err;
    local_a8 = timecode;
    bVar1 = Attribute::is_blocked(this_00);
    if (!bVar1) {
      tyid = Attribute::type_id(this_00);
      bVar1 = IsSupportedGeomPrimvarType(tyid);
      if (!bVar1) {
        if (err == (string *)0x0) {
          return false;
        }
        ::std::__cxx11::string::string
                  (local_70,"Unsupported type for GeomPrimvar. type = `{}`",(allocator *)&local_b0);
        Attribute::type_name_abi_cxx11_((string *)(local_a0 + 0x10),this_00);
        fmt::format<std::__cxx11::string>
                  (&local_50,(fmt *)local_70,(string *)(local_a0 + 0x10),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        ::std::__cxx11::string::append((string *)err);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        return false;
      }
      local_b0.s = 0.0;
      local_b0.t = 0.0;
      bVar1 = Attribute::get<tinyusdz::value::texcoord2f>(this_00,local_a8,&local_b0,interp);
      if (bVar1) {
        *dest = local_b0;
        return bVar1;
      }
      if (err != (string *)0x0) {
        ::std::__cxx11::string::string
                  (local_70,
                   "Get Attribute value at time {} failed. Maybe type mismatch?. Requested type `{}` but Attribute has type `{}`"
                   ,&local_b1);
        local_a0._12_4_ = 0x4a;
        Attribute::type_name_abi_cxx11_((string *)(local_a0 + 0x10),this_00);
        fmt::format<double,unsigned_int,std::__cxx11::string>
                  ((string *)&local_50,(fmt *)local_70,(string *)local_a0,(double *)(local_a0 + 0xc)
                   ,(uint *)(local_a0 + 0x10),in_R9);
        ::std::__cxx11::string::append((string *)err);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        return bVar1;
      }
      return bVar1;
    }
  }
  if (err != (string *)0x0) {
    ::std::__cxx11::string::append((char *)err);
  }
  return false;
}

Assistant:

bool GeomPrimvar::get_value(double timecode, T *dest, value::TimeSampleInterpolationType interp, std::string *err) const {
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<value::token>::type_id(), "`token` type is not supported as a GeomPrimvar");
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<std::vector<value::token>>::type_id(), "`token[]` type is not supported as a GeomPrimvar");

  if (!dest) {
    if (err) {
      (*err) += "Output value is nullptr.";
    }
    return false;
  }

  if (_attr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is blocked.";
    }
    return false;
  }

  if (!IsSupportedGeomPrimvarType(_attr.type_id())) {
    if (err) {
      (*err) += fmt::format("Unsupported type for GeomPrimvar. type = `{}`",
                            _attr.type_name());
    }
    return false;
  }

#if 0
  if (value::TimeCode(timecode).is_default()) {

    if (_attr.has_value()) {
      if (auto pv = _attr.get_value<T>()) {

        // copy
        (*dest) = pv.value();
        return true;

      } else {
        if (err) {
          (*err) += fmt::format("Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`", value::TypeTraits<T>::type_id(), _attr.type_name());
        }
        return false;
      }
    }

  }

  if (_attr.has_timesamples()) {
    T value;

    if (!_attr.get_value(timecode, &value, interp)) {
      if (err) {
        (*err) += fmt::format("Get Attribute value at time {} failed. Maybe type mismatch?. Requested type `{}` but Attribute has type `{}`", timecode, value::TypeTraits<T>::type_id(), _attr.type_name());
      }
      return false;
    }

    // copy
    (*dest) = value;
    return true;
  }

  return false;
#else
  T value{};

  if (!_attr.get_value(timecode, &value, interp)) {
    if (err) {
      (*err) += fmt::format("Get Attribute value at time {} failed. Maybe type mismatch?. Requested type `{}` but Attribute has type `{}`", timecode, value::TypeTraits<T>::type_id(), _attr.type_name());
    }
    return false;
  }

  // copy
  (*dest) = value;
  return true;
#endif

}